

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_write_encrypted_pms(mbedtls_ssl_context *ssl,size_t offset,size_t *olen,size_t pms_offset)

{
  int iVar1;
  long lVar2;
  uchar *ver;
  uchar *p;
  size_t len_bytes;
  int ret;
  size_t pms_offset_local;
  size_t *olen_local;
  size_t offset_local;
  mbedtls_ssl_context *ssl_local;
  
  iVar1 = 2;
  if (ssl->minor_ver == 0) {
    iVar1 = 0;
  }
  lVar2 = (long)iVar1;
  ver = ssl->handshake->premaster + pms_offset;
  if (offset + lVar2 < 0x4001) {
    mbedtls_ssl_write_version
              ((uint)ssl->conf->max_major_ver,(uint)ssl->conf->max_minor_ver,
               *(uint *)&ssl->conf->field_0x164 >> 1 & 1,ver);
    ssl_local._4_4_ = (*ssl->conf->f_rng)(ssl->conf->p_rng,ver + 2,0x2e);
    if (ssl_local._4_4_ == 0) {
      ssl->handshake->pmslen = 0x30;
      if (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x75e,"certificate required");
        ssl_local._4_4_ = -0x7700;
      }
      else {
        iVar1 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,MBEDTLS_PK_RSA);
        if (iVar1 == 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x768,"certificate key type mismatch");
          ssl_local._4_4_ = -0x6d00;
        }
        else {
          ssl_local._4_4_ =
               mbedtls_pk_encrypt(&ssl->session_negotiate->peer_cert->pk,ver,ssl->handshake->pmslen,
                                  ssl->out_msg + lVar2 + offset,olen,(0x4000 - offset) - lVar2,
                                  ssl->conf->f_rng,ssl->conf->p_rng);
          if (ssl_local._4_4_ == 0) {
            if (lVar2 == 2) {
              ssl->out_msg[offset] = (uchar)(*olen >> 8);
              ssl->out_msg[offset + 1] = (uchar)*olen;
              *olen = *olen + 2;
            }
            ssl_local._4_4_ = 0;
          }
          else {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x772,"mbedtls_rsa_pkcs1_encrypt",ssl_local._4_4_);
          }
        }
      }
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x756,"f_rng",ssl_local._4_4_);
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x746,"buffer too small for encrypted pms");
    ssl_local._4_4_ = -0x6a00;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_encrypted_pms( mbedtls_ssl_context *ssl,
                                    size_t offset, size_t *olen,
                                    size_t pms_offset )
{
    int ret;
    size_t len_bytes = ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 ? 0 : 2;
    unsigned char *p = ssl->handshake->premaster + pms_offset;

    if( offset + len_bytes > MBEDTLS_SSL_MAX_CONTENT_LEN )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "buffer too small for encrypted pms" ) );
        return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );
    }

    /*
     * Generate (part of) the pre-master as
     *  struct {
     *      ProtocolVersion client_version;
     *      opaque random[46];
     *  } PreMasterSecret;
     */
    mbedtls_ssl_write_version( ssl->conf->max_major_ver, ssl->conf->max_minor_ver,
                       ssl->conf->transport, p );

    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p + 2, 46 ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "f_rng", ret );
        return( ret );
    }

    ssl->handshake->pmslen = 48;

    if( ssl->session_negotiate->peer_cert == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "certificate required" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * Now write it out, encrypted
     */
    if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk,
                MBEDTLS_PK_RSA ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "certificate key type mismatch" ) );
        return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
    }

    if( ( ret = mbedtls_pk_encrypt( &ssl->session_negotiate->peer_cert->pk,
                            p, ssl->handshake->pmslen,
                            ssl->out_msg + offset + len_bytes, olen,
                            MBEDTLS_SSL_MAX_CONTENT_LEN - offset - len_bytes,
                            ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_rsa_pkcs1_encrypt", ret );
        return( ret );
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( len_bytes == 2 )
    {
        ssl->out_msg[offset+0] = (unsigned char)( *olen >> 8 );
        ssl->out_msg[offset+1] = (unsigned char)( *olen      );
        *olen += 2;
    }
#endif

    return( 0 );
}